

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_scalar_umul128_unroll2(uint16_t *in,uint32_t n,uint32_t *out)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 *puVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  
  auVar14._8_4_ = 0xfff;
  auVar14._0_8_ = 0xfff00000fff;
  auVar14._12_4_ = 0xfff;
  auVar16._16_4_ = 0xfff;
  auVar16._0_16_ = auVar14;
  auVar16._20_4_ = 0xfff;
  auVar16._24_4_ = 0xfff;
  auVar16._28_4_ = 0xfff;
  while (7 < n) {
    uVar7 = 0xfff;
    if (n < 0xfff) {
      uVar7 = n;
    }
    puVar6 = *(undefined1 (*) [16])in;
    uVar10 = n;
    if (0xffe < n) {
      uVar10 = 0xfff;
    }
    lVar9 = 0;
    lVar13 = 0;
    lVar8 = 0;
    lVar12 = 0;
    for (uVar11 = (ulong)((uVar10 >> 3) << 4); uVar11 != 0; uVar11 = uVar11 - 0x10) {
      uVar1 = *(ulong *)*(undefined1 (*) [16])in;
      uVar2 = *(ulong *)(*(undefined1 (*) [16])in + 8);
      in = (uint16_t *)((long)in + 0x10);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = (uVar2 & 0x1111111111111111) + (uVar1 & 0x1111111111111111);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (uVar2 & 0x2222222222222222) + (uVar1 & 0x2222222222222222) >> 1;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = (uVar2 & 0x4444444444444444) + (uVar1 & 0x4444444444444444) >> 2;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = (uVar2 >> 3 & 0x1111111111111111) + (uVar1 >> 3 & 0x1111111111111111);
      lVar12 = lVar12 + (SUB168(auVar15 * ZEXT816(0x1000100010001),8) +
                         SUB168(auVar15 * ZEXT816(0x1000100010001),0) & 0xf00f00f00fU);
      lVar8 = lVar8 + (SUB168(auVar4 * ZEXT816(0x1000100010001),8) +
                       SUB168(auVar4 * ZEXT816(0x1000100010001),0) & 0xf00f00f00fU);
      lVar13 = lVar13 + (SUB168(auVar25 * ZEXT816(0x1000100010001),8) +
                         SUB168(auVar25 * ZEXT816(0x1000100010001),0) & 0xf00f00f00fU);
      lVar9 = lVar9 + (SUB168(auVar22 * ZEXT816(0x1000100010001),8) +
                       SUB168(auVar22 * ZEXT816(0x1000100010001),0) & 0xf00f00f00fU);
    }
    auVar15 = vpinsrd_avx(ZEXT416((uint)lVar12),(int)lVar8,1);
    n = n - (uVar7 & 0xff8);
    auVar4 = vpinsrd_avx(ZEXT416((uint)((ulong)lVar12 >> 0x18)),(int)((ulong)lVar8 >> 0x18),1);
    auVar15 = vpinsrd_avx(auVar15,(int)lVar13,2);
    auVar4 = vpinsrd_avx(auVar4,(int)((ulong)lVar13 >> 0x18),2);
    auVar15 = vpinsrd_avx(auVar15,(int)lVar9,3);
    auVar25 = vpsrld_avx(auVar15,0xc);
    auVar4 = vpinsrd_avx(auVar4,(int)((ulong)lVar9 >> 0x18),3);
    auVar15 = vpand_avx(auVar15,auVar14);
    auVar23._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar4;
    auVar23._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar25;
    auVar4 = vpinsrd_avx(ZEXT416((uint)((ulong)lVar12 >> 0x24)),(uint)((ulong)lVar8 >> 0x24),1);
    auVar23 = vpand_avx2(auVar23,auVar16);
    auVar4 = vpinsrd_avx(auVar4,(uint)((ulong)lVar13 >> 0x24),2);
    auVar4 = vpinsrd_avx(auVar4,(uint)((ulong)lVar9 >> 0x24),3);
    auVar17 = vinserti64x4_avx512f
                        (ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                             ZEXT116(1) * auVar4,
                                             ZEXT116(0) * auVar4 + ZEXT116(1) * auVar15)),auVar23,1)
    ;
    auVar17 = vpaddd_avx512f(auVar17,*(undefined1 (*) [64])out);
    auVar17 = vmovdqu64_avx512f(auVar17);
    *(undefined1 (*) [64])out = auVar17;
    in = (uint16_t *)(puVar6 + (ulong)(uVar7 & 0xff8) * 2);
  }
  if (n != 0) {
    auVar17 = vpbroadcastq_avx512f(ZEXT816(0x5555));
    auVar18 = vpbroadcastq_avx512f(ZEXT816(0x40010004001));
    auVar19 = vpbroadcastq_avx512f(ZEXT816(0x101010101010101));
    auVar20 = vpbroadcastq_avx512f();
    uVar11 = vpcmpuq_avx512f(auVar20,_DAT_0010d280,5);
    auVar14 = vmovdqu16_avx512vl(*(undefined1 (*) [16])in);
    bVar3 = (byte)uVar11;
    auVar26._2_2_ = (ushort)((byte)(uVar11 >> 1) & 1) * auVar14._2_2_;
    auVar26._0_2_ = (ushort)(bVar3 & 1) * auVar14._0_2_;
    auVar26._4_2_ = (ushort)((byte)(uVar11 >> 2) & 1) * auVar14._4_2_;
    auVar26._6_2_ = (ushort)((byte)(uVar11 >> 3) & 1) * auVar14._6_2_;
    auVar26._8_2_ = (ushort)((byte)(uVar11 >> 4) & 1) * auVar14._8_2_;
    auVar26._10_2_ = (ushort)((byte)(uVar11 >> 5) & 1) * auVar14._10_2_;
    auVar26._12_2_ = (ushort)((byte)(uVar11 >> 6) & 1) * auVar14._12_2_;
    auVar26._14_2_ = (ushort)(byte)(uVar11 >> 7) * auVar14._14_2_;
    auVar20 = vpmovzxwq_avx512f(auVar26);
    auVar21 = vpandq_avx512f(auVar20,auVar17);
    auVar20 = vpsrlq_avx512f(auVar20,1);
    auVar21 = vpmullq_avx512dq(auVar21,auVar18);
    auVar17 = vpandq_avx512f(auVar20,auVar17);
    auVar17 = vpmullq_avx512dq(auVar17,auVar18);
    auVar18 = vpandq_avx512f(auVar21,auVar19);
    auVar20._8_8_ = (ulong)((byte)(uVar11 >> 1) & 1) * auVar18._8_8_;
    auVar20._0_8_ = (ulong)(bVar3 & 1) * auVar18._0_8_;
    auVar20._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * auVar18._16_8_;
    auVar20._24_8_ = (ulong)((byte)(uVar11 >> 3) & 1) * auVar18._24_8_;
    auVar20._32_8_ = (ulong)((byte)(uVar11 >> 4) & 1) * auVar18._32_8_;
    auVar20._40_8_ = (ulong)((byte)(uVar11 >> 5) & 1) * auVar18._40_8_;
    auVar20._48_8_ = (ulong)((byte)(uVar11 >> 6) & 1) * auVar18._48_8_;
    auVar20._56_8_ = (uVar11 >> 7) * auVar18._56_8_;
    auVar16 = vextracti64x4_avx512f(auVar20,1);
    auVar17 = vpandq_avx512f(auVar17,auVar19);
    auVar18._8_8_ = (ulong)((byte)(uVar11 >> 1) & 1) * auVar17._8_8_;
    auVar18._0_8_ = (ulong)(bVar3 & 1) * auVar17._0_8_;
    auVar18._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * auVar17._16_8_;
    auVar18._24_8_ = (ulong)((byte)(uVar11 >> 3) & 1) * auVar17._24_8_;
    auVar18._32_8_ = (ulong)((byte)(uVar11 >> 4) & 1) * auVar17._32_8_;
    auVar18._40_8_ = (ulong)((byte)(uVar11 >> 5) & 1) * auVar17._40_8_;
    auVar18._48_8_ = (ulong)((byte)(uVar11 >> 6) & 1) * auVar17._48_8_;
    auVar18._56_8_ = (uVar11 >> 7) * auVar17._56_8_;
    auVar17 = vpaddq_avx512f(auVar20,ZEXT3264(auVar16));
    auVar14 = vpaddq_avx(auVar17._0_16_,auVar17._16_16_);
    auVar15 = vpshufd_avx(auVar14,0xee);
    auVar14 = vpaddq_avx(auVar14,auVar15);
    auVar16 = vextracti64x4_avx512f(auVar18,1);
    auVar17 = vpaddq_avx512f(auVar18,ZEXT3264(auVar16));
    auVar15 = vpaddq_avx(auVar17._0_16_,auVar17._16_16_);
    auVar4 = vpshufd_avx(auVar15,0xee);
    auVar15 = vpaddq_avx(auVar15,auVar4);
    auVar25 = vpunpckldq_avx(auVar14,auVar15);
    auVar22 = vpunpcklqdq_avx(auVar14,auVar15);
    auVar4 = vpshufb_avx(auVar22,_DAT_0010d030);
    auVar27._0_16_ = ZEXT116(0) * auVar22 + ZEXT116(1) * auVar22;
    auVar27._16_16_ = ZEXT116(1) * auVar22;
    auVar16 = vpsrlvq_avx2(auVar27,_DAT_0010d9a0);
    auVar26 = vpsrld_avx(auVar25,8);
    auVar25 = vpshufb_avx(auVar25,_DAT_0010d040);
    auVar22 = vpsrlq_avx(auVar22,0x38);
    auVar14 = vpinsrd_avx(auVar26,auVar14._0_4_,2);
    auVar14 = vpinsrd_avx(auVar14,auVar15._0_4_,3);
    auVar14 = vpshufb_avx(auVar14,_DAT_0010d020);
    auVar15 = vpmovqd_avx512vl(auVar16);
    auVar24._0_16_ = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar25;
    auVar24._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar15;
    auVar5._8_4_ = 0xff;
    auVar5._0_8_ = 0xff000000ff;
    auVar5._12_4_ = 0xff;
    auVar5._16_4_ = 0xff;
    auVar5._20_4_ = 0xff;
    auVar5._24_4_ = 0xff;
    auVar5._28_4_ = 0xff;
    auVar16 = vpandd_avx512vl(auVar24,auVar5);
    auVar17 = vinserti32x4_avx512f(ZEXT3264(auVar16),auVar14,2);
    auVar18 = vpmovsxbd_avx512f(_DAT_0010d050);
    auVar17 = vinserti32x4_avx512f(auVar17,auVar4,3);
    auVar17 = vpermi2d_avx512f(auVar18,auVar17,ZEXT1664(auVar22));
    auVar17 = vpaddd_avx512f(auVar17,*(undefined1 (*) [64])out);
    auVar17 = vmovdqu64_avx512f(auVar17);
    *(undefined1 (*) [64])out = auVar17;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_scalar_umul128_unroll2(const uint16_t* in, uint32_t n, uint32_t* out) {
    while (n >= 8) {
        uint64_t counter_a = 0; // 4 packed 12-bit counters
        uint64_t counter_b = 0;
        uint64_t counter_c = 0;
        uint64_t counter_d = 0;

        // end before overflowing the counters
        uint32_t len = ((n < 0x0FFF) ? n : 0x0FFF) & ~7;
        n -= len;
        for (const uint16_t* end = &in[len]; in != end; in += 8) {
            const uint64_t mask_a = UINT64_C(0x1111111111111111);
            const uint64_t mask_b = mask_a + mask_a;
            const uint64_t mask_c = mask_b + mask_b;
            const uint64_t mask_0001 = UINT64_C(0x0001000100010001);
            const uint64_t mask_cnts = UINT64_C(0x000000F00F00F00F);

            uint64_t v0 = pospopcnt_loadu_u64(&in[0]);
            uint64_t v1 = pospopcnt_loadu_u64(&in[4]);

            uint64_t a = (v0 & mask_a) + (v1 & mask_a);
            uint64_t b = ((v0 & mask_b) + (v1 & mask_b)) >> 1;
            uint64_t c = ((v0 & mask_c) + (v1 & mask_c)) >> 2;
            uint64_t d = ((v0 >> 3) & mask_a) + ((v1 >> 3) & mask_a);

            uint64_t hi;
            a = pospopcnt_umul128(a, mask_0001, &hi);
            a += hi; // broadcast 4-bit counts
            b = pospopcnt_umul128(b, mask_0001, &hi);
            b += hi;
            c = pospopcnt_umul128(c, mask_0001, &hi);
            c += hi;
            d = pospopcnt_umul128(d, mask_0001, &hi);
            d += hi;

            counter_a += a & mask_cnts;
            counter_b += b & mask_cnts;
            counter_c += c & mask_cnts;
            counter_d += d & mask_cnts;
        }

        out[0] += counter_a & 0x0FFF;
        out[1] += counter_b & 0x0FFF;
        out[2] += counter_c & 0x0FFF;
        out[3] += counter_d & 0x0FFF;
        out[4] += (counter_a >> 36);
        out[5] += (counter_b >> 36);
        out[6] += (counter_c >> 36);
        out[7] += (counter_d >> 36);
        out[8] += (counter_a >> 24) & 0x0FFF;
        out[9] += (counter_b >> 24) & 0x0FFF;
        out[10] += (counter_c >> 24) & 0x0FFF;
        out[11] += (counter_d >> 24) & 0x0FFF;
        out[12] += (counter_a >> 12) & 0x0FFF;
        out[13] += (counter_b >> 12) & 0x0FFF;
        out[14] += (counter_c >> 12) & 0x0FFF;
        out[15] += (counter_d >> 12) & 0x0FFF;
    }

    // assert(n < 8)
    if (n != 0) {
        uint64_t tail_counter_a = 0;
        uint64_t tail_counter_b = 0;
        do { // zero-extend a bit to 8-bits (emulate pdep) then accumulate
            const uint64_t mask_01 = UINT64_C(0x0101010101010101);
            const uint64_t magic   = UINT64_C(0x0000040010004001); // 1+(1<<14)+(1<<28)+(1<<42)
            uint64_t x = *in++;
            tail_counter_a += ((x & 0x5555) * magic) & mask_01; // 0101010101010101
            tail_counter_b += (((x >> 1) & 0x5555) * magic) & mask_01;
        } while (--n);

        out[0]  += tail_counter_a & 0xFF;
        out[8]  += (tail_counter_a >>  8) & 0xFF;
        out[2]  += (tail_counter_a >> 16) & 0xFF;
        out[10] += (tail_counter_a >> 24) & 0xFF;
        out[4]  += (tail_counter_a >> 32) & 0xFF;
        out[12] += (tail_counter_a >> 40) & 0xFF;
        out[6]  += (tail_counter_a >> 48) & 0xFF;
        out[14] += (tail_counter_a >> 56) & 0xFF;
        out[1]  += tail_counter_b & 0xFF;
        out[9]  += (tail_counter_b >>  8) & 0xFF;
        out[3]  += (tail_counter_b >> 16) & 0xFF;
        out[11] += (tail_counter_b >> 24) & 0xFF;
        out[5]  += (tail_counter_b >> 32) & 0xFF;
        out[13] += (tail_counter_b >> 40) & 0xFF;
        out[7]  += (tail_counter_b >> 48) & 0xFF;
        out[15] += (tail_counter_b >> 56) & 0xFF;
    }

    return 0;
}